

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

float PredictionCostSpatial(int *counts,int weight_0,double exp_val)

{
  int i;
  double bits;
  double exp_decay_factor;
  int significant_symbols;
  double exp_val_local;
  int weight_0_local;
  int *counts_local;
  
  bits = (double)(weight_0 * *counts);
  exp_val_local = exp_val;
  for (i = 1; i < 0x10; i = i + 1) {
    bits = exp_val_local * (double)(counts[i] + counts[0x100 - i]) + bits;
    exp_val_local = exp_val_local * 0.6;
  }
  return (float)(bits * -0.1);
}

Assistant:

static float PredictionCostSpatial(const int counts[256], int weight_0,
                                   double exp_val) {
  const int significant_symbols = 256 >> 4;
  const double exp_decay_factor = 0.6;
  double bits = weight_0 * counts[0];
  int i;
  for (i = 1; i < significant_symbols; ++i) {
    bits += exp_val * (counts[i] + counts[256 - i]);
    exp_val *= exp_decay_factor;
  }
  return (float)(-0.1 * bits);
}